

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall TransactionContext_AddSign_Test::TestBody(TransactionContext_AddSign_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  reference outpoint;
  char *pcVar3;
  AssertionResult gtest_ar;
  ByteData der_bytes2;
  ByteData der_bytes1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  uint32_t vout;
  Txid txid;
  Script redeem_script;
  TransactionContext ctx;
  value_type *in_stack_fffffffffffffa58;
  undefined2 uVar4;
  undefined5 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa65;
  undefined1 in_stack_fffffffffffffa66;
  undefined1 in_stack_fffffffffffffa67;
  TransactionContext *this_00;
  Script *in_stack_fffffffffffffa78;
  SignParameter *in_stack_fffffffffffffa80;
  allocator *paVar5;
  SigHashType *sighash_type;
  allocator *paVar6;
  SignParameter *this_01;
  AssertHelper local_550;
  Message local_548;
  string local_540;
  AssertionResult local_520;
  AssertHelper local_510;
  Message local_508 [2];
  OutPoint local_4f8;
  undefined1 local_4c9 [245];
  SigHashType local_3d4 [11];
  SigHashType local_34c [11];
  ByteData local_2c8 [6];
  undefined1 local_231 [33];
  ByteData local_210;
  allocator local_1f1;
  string local_1f0;
  ByteData local_1d0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_1b8;
  uint32_t local_1a0;
  allocator local_199;
  string local_198;
  Txid local_178;
  undefined1 local_151 [145];
  AbstractTransaction local_c0 [12];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_151 + 0x71),
             "02000000014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010100000000000000220020301e775bc1c43e8e032960fd0cd5b0009a3389b4f1b5a53072cde02559fa1d6e00000000"
             ,(allocator *)((long)local_151 + 0x70));
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             (string *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)(local_151 + 0x71));
  std::allocator<char>::~allocator((allocator<char> *)((long)local_151 + 0x70));
  this_01 = (SignParameter *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_151 + 1),
             "522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae"
             ,(allocator *)this_01);
  cfd::core::Script::Script((Script *)((long)local_151 + 0x21),(string *)((long)local_151 + 1));
  std::__cxx11::string::~string((string *)((long)local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  paVar5 = &local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_198,"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c"
             ,paVar5);
  cfd::core::Txid::Txid(&local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  local_1a0 = 0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x247631);
  paVar6 = &local_1f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb"
             ,paVar6);
  uVar1 = (undefined1)((ulong)paVar6 >> 0x38);
  cfd::core::ByteData::ByteData(&local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  sighash_type = (SigHashType *)local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_231 + 1),
             "30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601"
             ,(allocator *)sighash_type);
  cfd::core::ByteData::ByteData(&local_210,(string *)(local_231 + 1));
  std::__cxx11::string::~string((string *)(local_231 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_231);
  cfd::core::ByteData::ByteData(local_2c8);
  cfd::SignParameter::SignParameter(in_stack_fffffffffffffa80,(ByteData *)in_stack_fffffffffffffa78)
  ;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             in_stack_fffffffffffffa58);
  cfd::SignParameter::~SignParameter
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))));
  cfd::core::ByteData::~ByteData((ByteData *)0x247744);
  cfd::core::SigHashType::SigHashType(local_34c,kSigHashAll,false,false);
  cfd::SignParameter::SignParameter(this_01,(ByteData *)paVar5,(bool)uVar1,sighash_type);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             in_stack_fffffffffffffa58);
  cfd::SignParameter::~SignParameter
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))));
  cfd::core::SigHashType::SigHashType(local_3d4,kSigHashAll,false,false);
  cfd::SignParameter::SignParameter(this_01,(ByteData *)paVar5,(bool)uVar1,sighash_type);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             in_stack_fffffffffffffa58);
  cfd::SignParameter::~SignParameter
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))));
  cfd::SignParameter::SignParameter(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             in_stack_fffffffffffffa58);
  cfd::SignParameter::~SignParameter
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))));
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::operator[](&local_1b8,1);
  paVar5 = (allocator *)((long)local_4c9 + 0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_4c9 + 0x41),
             "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",paVar5);
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_4c9 + 0x61),(string *)((long)local_4c9 + 0x41));
  cfd::SignParameter::SetRelatedPubkey
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             (Pubkey *)in_stack_fffffffffffffa58);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2478b8);
  std::__cxx11::string::~string((string *)((long)local_4c9 + 0x41));
  std::allocator<char>::~allocator((allocator<char> *)((long)local_4c9 + 0x40));
  outpoint = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::operator[]
                       (&local_1b8,2);
  this_00 = (TransactionContext *)local_4c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_4c9 + 1),
             "02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5",
             (allocator *)this_00);
  cfd::core::Pubkey::Pubkey((Pubkey *)((long)local_4c9 + 0x21),(string *)((long)local_4c9 + 1));
  cfd::SignParameter::SetRelatedPubkey
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             (Pubkey *)in_stack_fffffffffffffa58);
  uVar4 = (undefined2)((ulong)in_stack_fffffffffffffa58 >> 0x30);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x24794e);
  std::__cxx11::string::~string((string *)((long)local_4c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4c9);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    in_stack_fffffffffffffa66 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffa66) {
      cfd::core::OutPoint::OutPoint(&local_4f8,&local_178,local_1a0);
      cfd::TransactionContext::AddSign
                (this_00,(OutPoint *)outpoint,
                 (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffa66,
                                         CONCAT15(in_stack_fffffffffffffa65,
                                                  in_stack_fffffffffffffa60))),
                 SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2479eb);
    }
  }
  else {
    testing::Message::Message(local_508);
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x187,
               "Expected: ctx.AddSign(OutPoint(txid, vout), signatures, true, true) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_510,local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    testing::Message::~Message((Message *)0x247dd1);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_540,local_c0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_520,"ctx.GetHex().c_str()",
             "\"020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010100000000000000220020301e775bc1c43e8e032960fd0cd5b0009a3389b4f1b5a53072cde02559fa1d6e04004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae00000000\""
             ,pcVar3,
             "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010100000000000000220020301e775bc1c43e8e032960fd0cd5b0009a3389b4f1b5a53072cde02559fa1d6e04004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae00000000"
            );
  std::__cxx11::string::~string((string *)&local_540);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_548);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x247ee2);
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x189,pcVar3);
    testing::internal::AssertHelper::operator=(&local_550,&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    testing::Message::~Message((Message *)0x247f2e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x247f7d);
  cfd::core::ByteData::~ByteData((ByteData *)0x247f8a);
  cfd::core::ByteData::~ByteData((ByteData *)0x247f97);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)this_00);
  cfd::core::Txid::~Txid((Txid *)0x247fb1);
  cfd::core::Script::~Script
            ((Script *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffa66,
                                     CONCAT15(uVar2,in_stack_fffffffffffffa60))));
  cfd::TransactionContext::~TransactionContext
            ((TransactionContext *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffa66,
                                     CONCAT15(uVar2,in_stack_fffffffffffffa60))));
  return;
}

Assistant:

TEST(TransactionContext, AddSign) {
  // P2wpkhMultisig
  TransactionContext ctx("02000000014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010100000000000000220020301e775bc1c43e8e032960fd0cd5b0009a3389b4f1b5a53072cde02559fa1d6e00000000");
  Script redeem_script("522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae");

  Txid txid("ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c");
  uint32_t vout = 0;

  std::vector<SignParameter> signatures;
  ByteData der_bytes1("47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb");
  ByteData der_bytes2("30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601");
  signatures.push_back(SignParameter(ByteData()));
  signatures.push_back(SignParameter(der_bytes2, false));
  signatures.push_back(SignParameter(der_bytes1, true));
  signatures.push_back(SignParameter(redeem_script));
  signatures[1].SetRelatedPubkey(Pubkey("02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef"));
  signatures[2].SetRelatedPubkey(Pubkey("02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5"));

  EXPECT_NO_THROW(ctx.AddSign(OutPoint(txid, vout), signatures, true, true));

  EXPECT_STREQ(ctx.GetHex().c_str(), "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010100000000000000220020301e775bc1c43e8e032960fd0cd5b0009a3389b4f1b5a53072cde02559fa1d6e04004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae00000000");
}